

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3OpenTable(Parse *pParse,int iCur,int iDb,Table *pTab,int opcode)

{
  Vdbe *p;
  Index *pIdx;
  
  p = sqlite3GetVdbe(pParse);
  sqlite3TableLock(pParse,iDb,pTab->tnum,opcode == 0x69,pTab->zName);
  if ((pTab->tabFlags & 0x20) == 0) {
    sqlite3VdbeAddOp4Int(p,opcode,iCur,pTab->tnum,iDb,(int)pTab->nCol);
    return;
  }
  pIdx = sqlite3PrimaryKeyIndex(pTab);
  sqlite3VdbeAddOp3(p,opcode,iCur,pIdx->tnum,iDb);
  sqlite3VdbeSetP4KeyInfo(pParse,pIdx);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3OpenTable(
  Parse *pParse,  /* Generate code into this VDBE */
  int iCur,       /* The cursor number of the table */
  int iDb,        /* The database index in sqlite3.aDb[] */
  Table *pTab,    /* The table to be opened */
  int opcode      /* OP_OpenRead or OP_OpenWrite */
){
  Vdbe *v;
  assert( !IsVirtual(pTab) );
  v = sqlite3GetVdbe(pParse);
  assert( opcode==OP_OpenWrite || opcode==OP_OpenRead );
  sqlite3TableLock(pParse, iDb, pTab->tnum, 
                   (opcode==OP_OpenWrite)?1:0, pTab->zName);
  if( HasRowid(pTab) ){
    sqlite3VdbeAddOp4Int(v, opcode, iCur, pTab->tnum, iDb, pTab->nCol);
    VdbeComment((v, "%s", pTab->zName));
  }else{
    Index *pPk = sqlite3PrimaryKeyIndex(pTab);
    assert( pPk!=0 );
    assert( pPk->tnum==pTab->tnum );
    sqlite3VdbeAddOp3(v, opcode, iCur, pPk->tnum, iDb);
    sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    VdbeComment((v, "%s", pTab->zName));
  }
}